

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O1

loc origin_get_loc(source origin)

{
  monster *pmVar1;
  loc lVar2;
  loc lVar3;
  
  switch(origin.what) {
  case SRC_TRAP:
    lVar2 = (loc)(origin.which.object)->prev;
    break;
  case SRC_PLAYER:
  case SRC_OBJECT:
  case SRC_CHEST_TRAP:
    lVar2.x = (player->grid).x;
    lVar2.y = (player->grid).y;
    break;
  case SRC_MONSTER:
    pmVar1 = cave_monster(cave,origin.which._0_4_);
    if (pmVar1 != (monster *)0x0) {
      lVar3.x = (pmVar1->grid).x;
      lVar3.y = (pmVar1->grid).y;
      return lVar3;
    }
  default:
    lVar3 = (loc)loc(-1,-1);
    return lVar3;
  }
  return lVar2;
}

Assistant:

struct loc origin_get_loc(struct source origin)
{
	switch (origin.what) {
		case SRC_MONSTER: {
			struct monster *who = cave_monster(cave, origin.which.monster);
			return who ? who->grid : loc(-1, -1);
		}

		case SRC_TRAP: {
			struct trap *trap = origin.which.trap;
			return trap->grid;
		}

		case SRC_PLAYER:
		case SRC_OBJECT:	/* Currently only worn cursed objects use this */
		case SRC_CHEST_TRAP:
			return player->grid;

		case SRC_NONE:
			return loc(-1, -1);
	}

	return loc(-1, -1);
}